

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O2

int __thiscall
ExtraData::getVectorHeader(ExtraData *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *val)

{
  uint uVar1;
  ostream *poVar2;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> _Stack_28;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_28,val);
  uVar1 = Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_28);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&_Stack_28);
  poVar2 = std::operator<<((ostream *)&std::cout,"              VectorHeader:         ");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"                 Length:            ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = std::operator<<(poVar2," bytes. ");
  std::endl<char,std::char_traits<char>>(poVar2);
  return uVar1;
}

Assistant:

int ExtraData::getVectorHeader(std::vector<unsigned int> val) {
    int len = Utils::lenFourBytes(val);
    cout << "              VectorHeader:         " << endl;
    cout << "                 Length:            " << dec << len << " bytes. " << endl;
    return len;
}